

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::ValueType::CheckTypeAndMergeFrom(ValueType *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  StateType *this_00;
  TupleType *this_01;
  DictionaryType *this_02;
  TensorType *this_03;
  ListType *this_04;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__ValueType_004849a8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::MILSpec::ValueType *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((ValueType *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0xcd8);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  switch(*(undefined4 *)((long)&from[1]._internal_metadata_.ptr_ + 4)) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_04 = (this->type_).listtype_;
LAB_002061c9:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_type(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_04 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::ListType>(pAVar3);
      (this->type_).listtype_ = this_04;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 2) goto LAB_002061c9;
      puVar2 = _ListType_default_instance_;
    }
    ListType::MergeFrom(this_04,(ListType *)puVar2);
    goto switchD_0020603d_default;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_01 = (this->type_).tupletype_;
LAB_0020610e:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_type(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_01 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::TupleType>(pAVar3);
      (this->type_).tupletype_ = this_01;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 3) goto LAB_0020610e;
      puVar2 = _TupleType_default_instance_;
    }
    TupleType::MergeFrom(this_01,(TupleType *)puVar2);
    goto switchD_0020603d_default;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_02 = (this->type_).dictionarytype_;
LAB_00206150:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_type(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_02 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::DictionaryType>(pAVar3);
      (this->type_).dictionarytype_ = this_02;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 4) goto LAB_00206150;
      puVar2 = _DictionaryType_default_instance_;
    }
    DictionaryType::MergeFrom(this_02,(DictionaryType *)puVar2);
    goto switchD_0020603d_default;
  case 5:
    if (this->_oneof_case_[0] == 5) {
      this_00 = (this->type_).statetype_;
LAB_002060cc:
      puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_type(this);
      this->_oneof_case_[0] = 5;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::StateType>(pAVar3);
      (this->type_).statetype_ = this_00;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 5) goto LAB_002060cc;
      puVar2 = _StateType_default_instance_;
    }
    StateType::MergeFrom(this_00,(StateType *)puVar2);
  default:
    goto switchD_0020603d_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_03 = (this->type_).tensortype_;
LAB_0020618e:
    puVar2 = (undefined1 *)from[1]._vptr_MessageLite;
  }
  else {
    clear_type(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_03 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::TensorType>(pAVar3);
    (this->type_).tensortype_ = this_03;
    if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 1) goto LAB_0020618e;
    puVar2 = _TensorType_default_instance_;
  }
  TensorType::MergeFrom(this_03,(TensorType *)puVar2);
switchD_0020603d_default:
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}